

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O0

Byte ReadByte(void *pp)

{
  Byte *pBVar1;
  undefined4 uVar2;
  long in_RDI;
  size_t size;
  CByteInToLook *p;
  long local_20;
  long local_18;
  Byte local_1;
  
  if (*(long *)(in_RDI + 8) == *(long *)(in_RDI + 0x10)) {
    local_18 = in_RDI;
    if (*(int *)(in_RDI + 0x2c) == 0) {
      local_20 = *(long *)(in_RDI + 8) - *(long *)(in_RDI + 0x18);
      *(long *)(in_RDI + 0x20) = local_20 + *(long *)(in_RDI + 0x20);
      uVar2 = (**(code **)(*(long *)(in_RDI + 0x30) + 8))(*(undefined8 *)(in_RDI + 0x30),local_20);
      *(undefined4 *)(local_18 + 0x2c) = uVar2;
      local_20 = 0x2000000;
      uVar2 = (*(code *)**(undefined8 **)(local_18 + 0x30))
                        (*(undefined8 *)(local_18 + 0x30),local_18 + 0x18,&local_20);
      *(undefined4 *)(local_18 + 0x2c) = uVar2;
      *(undefined8 *)(local_18 + 8) = *(undefined8 *)(local_18 + 0x18);
      *(long *)(local_18 + 0x10) = *(long *)(local_18 + 0x18) + local_20;
      if (local_20 != 0) {
        pBVar1 = *(Byte **)(local_18 + 8);
        *(Byte **)(local_18 + 8) = pBVar1 + 1;
        return *pBVar1;
      }
    }
    *(undefined4 *)(local_18 + 0x28) = 1;
    local_1 = '\0';
  }
  else {
    pBVar1 = *(Byte **)(in_RDI + 8);
    *(Byte **)(in_RDI + 8) = pBVar1 + 1;
    local_1 = *pBVar1;
  }
  return local_1;
}

Assistant:

static Byte ReadByte(void *pp)
{
  CByteInToLook *p = (CByteInToLook *)pp;
  if (p->cur != p->end)
    return *p->cur++;
  if (p->res == SZ_OK)
  {
    size_t size = p->cur - p->begin;
    p->processed += size;
    p->res = p->inStream->Skip(p->inStream, size);
    size = (1 << 25);
    p->res = p->inStream->Look(p->inStream, (const void **)&p->begin, &size);
    p->cur = p->begin;
    p->end = p->begin + size;
    if (size != 0)
      return *p->cur++;;
  }
  p->extra = True;
  return 0;
}